

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_timer.cpp
# Opt level: O2

void KokkosTools::KernelTimer::kokkosp_finalize_library(void)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *__name;
  FILE *__s;
  _Rb_tree_node_base *p_Var4;
  _Self __tmp_1;
  KernelPerformanceInfo *pKVar5;
  char *pcVar6;
  _Self __tmp;
  bool bVar7;
  double dVar8;
  double local_158;
  double totalExecuteTime;
  char *local_140;
  char currentwd [256];
  
  dVar8 = seconds();
  pcVar3 = getenv("KOKKOS_TOOLS_TIMER_JSON");
  if (pcVar3 == (char *)0x0) {
    bVar7 = false;
  }
  else {
    if ((*pcVar3 != '1') || (pcVar3[1] != '\0')) {
      iVar1 = strcmp(pcVar3,"true");
      if (iVar1 != 0) {
        iVar1 = strcmp(pcVar3,"True");
        bVar7 = iVar1 == 0;
        goto LAB_001058e6;
      }
    }
    bVar7 = true;
  }
LAB_001058e6:
  __name = (char *)malloc(0x100);
  gethostname(__name,0x100);
  pcVar3 = (char *)malloc(0x100);
  uVar2 = getpid();
  pcVar6 = "dat";
  if (bVar7) {
    pcVar6 = "json";
  }
  snprintf(pcVar3,0x100,"%s-%d.%s",__name,(ulong)uVar2,pcVar6);
  free(__name);
  __s = fopen(pcVar3,"wb");
  totalExecuteTime = dVar8 - initTime;
  if (bVar7) {
    currentwd[0] = '\0';
    currentwd[1] = '\0';
    currentwd[2] = '\0';
    currentwd[3] = '\0';
    currentwd[4] = '\0';
    currentwd[5] = '\0';
    currentwd[6] = '\0';
    currentwd[7] = '\0';
    currentwd[8] = '\0';
    currentwd[9] = '\0';
    currentwd[10] = '\0';
    currentwd[0xb] = '\0';
    currentwd[0xc] = '\0';
    currentwd[0xd] = '\0';
    currentwd[0xe] = '\0';
    currentwd[0xf] = '\0';
    currentwd[0x10] = '\0';
    currentwd[0x11] = '\0';
    currentwd[0x12] = '\0';
    currentwd[0x13] = '\0';
    currentwd[0x14] = '\0';
    currentwd[0x15] = '\0';
    currentwd[0x16] = '\0';
    currentwd[0x17] = '\0';
    local_158 = 0.0;
    for (p_Var4 = (_Rb_tree_node_base *)count_map_abi_cxx11_._24_8_;
        p_Var4 != (_Rb_tree_node_base *)(count_map_abi_cxx11_ + 8);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      std::
      vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ::push_back((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                   *)currentwd,(value_type *)(p_Var4 + 2));
      local_158 = local_158 + *(double *)(*(long *)(p_Var4 + 2) + 0x28);
    }
    local_140 = pcVar3;
    std::
    __sort<__gnu_cxx::__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo**,std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(KokkosTools::KernelTimer::KernelPerformanceInfo*,KokkosTools::KernelTimer::KernelPerformanceInfo*)>>
              ((__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )currentwd._0_8_,
               (__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )currentwd._8_8_,
               (_Iter_comp_iter<bool_(*)(KokkosTools::KernelTimer::KernelPerformanceInfo_*,_KokkosTools::KernelTimer::KernelPerformanceInfo_*)>
                )compareKernelPerformanceInfo);
    fwrite("{\n\"kokkos-kernel-data\" : {\n",0x1b,1,__s);
    dVar8 = totalExecuteTime;
    fprintf(__s,"    \"total-app-time\"         : %10.3f,\n");
    fprintf(__s,"    \"total-kernel-times\"     : %10.3f,\n",local_158);
    fprintf(__s,"    \"total-non-kernel-times\" : %10.3f,\n",dVar8 - local_158);
    fprintf(__s,"    \"percent-in-kernels\"     : %6.2f,\n",(local_158 / dVar8) * 100.0);
    bVar7 = false;
    fprintf(__s,"    \"unique-kernel-calls\"    : %22llu,\n",count_map_abi_cxx11_._40_8_);
    fputc(10,__s);
    fwrite("    \"region-perf-info\"       : [\n",0x21,1,__s);
    for (p_Var4 = (_Rb_tree_node_base *)count_map_abi_cxx11_._24_8_;
        p_Var4 != (_Rb_tree_node_base *)(count_map_abi_cxx11_ + 8);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      pKVar5 = *(KernelPerformanceInfo **)(p_Var4 + 2);
      if (pKVar5->kType == REGION) {
        if (bVar7) {
          fwrite(",\n",2,1,__s);
          pKVar5 = *(KernelPerformanceInfo **)(p_Var4 + 2);
        }
        bVar7 = true;
        KernelPerformanceInfo::writeToJSONFile(pKVar5,(FILE *)__s,"       ");
      }
    }
    fputc(10,__s);
    fwrite("    ],\n",7,1,__s);
    fwrite("    \"kernel-perf-info\"       : [\n",0x21,1,__s);
    bVar7 = false;
    for (p_Var4 = (_Rb_tree_node_base *)count_map_abi_cxx11_._24_8_;
        p_Var4 != (_Rb_tree_node_base *)(count_map_abi_cxx11_ + 8);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      pKVar5 = *(KernelPerformanceInfo **)(p_Var4 + 2);
      if (pKVar5->kType != REGION) {
        if (bVar7) {
          fwrite(",\n",2,1,__s);
          pKVar5 = *(KernelPerformanceInfo **)(p_Var4 + 2);
        }
        bVar7 = true;
        KernelPerformanceInfo::writeToJSONFile(pKVar5,(FILE *)__s,"       ");
      }
    }
    fputc(10,__s);
    fwrite("    ]\n",6,1,__s);
    fwrite("}\n}",3,1,__s);
    std::
    _Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
    ::~_Vector_base((_Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                     *)currentwd);
    pcVar3 = local_140;
  }
  else {
    fwrite(&totalExecuteTime,8,1,__s);
    for (p_Var4 = (_Rb_tree_node_base *)count_map_abi_cxx11_._24_8_;
        p_Var4 != (_Rb_tree_node_base *)(count_map_abi_cxx11_ + 8);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      KernelPerformanceInfo::writeToBinaryFile(*(KernelPerformanceInfo **)(p_Var4 + 2),(FILE *)__s);
    }
  }
  fclose(__s);
  getcwd(currentwd,0x100);
  printf("KokkosP: Kernel timing written to %s/%s \n",currentwd,pcVar3);
  return;
}

Assistant:

void kokkosp_finalize_library() {
  double finishTime = seconds();

  const char* kokkos_tools_timer_json_raw = getenv("KOKKOS_TOOLS_TIMER_JSON");
  const bool kokkos_tools_timer_json =
      kokkos_tools_timer_json_raw == NULL
          ? false
          : strcmp(kokkos_tools_timer_json_raw, "1") == 0 ||
                strcmp(kokkos_tools_timer_json_raw, "true") == 0 ||
                strcmp(kokkos_tools_timer_json_raw, "True") == 0;

  double kernelTimes = 0;

  char* hostname = (char*)malloc(sizeof(char) * 256);
  gethostname(hostname, 256);

  char* fileOutput = (char*)malloc(sizeof(char) * 256);
  snprintf(fileOutput, 256, "%s-%d.%s", hostname, (int)getpid(),
           kokkos_tools_timer_json ? "json" : "dat");

  free(hostname);
  FILE* output_data = fopen(fileOutput, "wb");

  const double totalExecuteTime = (finishTime - initTime);
  if (!kokkos_tools_timer_json) {
    fwrite(&totalExecuteTime, sizeof(totalExecuteTime), 1, output_data);

    for (auto kernel_itr = count_map.begin(); kernel_itr != count_map.end();
         kernel_itr++) {
      kernel_itr->second->writeToBinaryFile(output_data);
    }
  } else {
    std::vector<KernelPerformanceInfo*> kernelList;

    for (auto kernel_itr = count_map.begin(); kernel_itr != count_map.end();
         kernel_itr++) {
      kernelList.push_back(kernel_itr->second);
      kernelTimes += kernel_itr->second->getTime();
    }

    std::sort(kernelList.begin(), kernelList.end(),
              compareKernelPerformanceInfo);

    fprintf(output_data, "{\n\"kokkos-kernel-data\" : {\n");
    fprintf(output_data, "    \"total-app-time\"         : %10.3f,\n",
            totalExecuteTime);
    fprintf(output_data, "    \"total-kernel-times\"     : %10.3f,\n",
            kernelTimes);
    fprintf(output_data, "    \"total-non-kernel-times\" : %10.3f,\n",
            (totalExecuteTime - kernelTimes));

    const double percentKokkos = (kernelTimes / totalExecuteTime) * 100.0;
    fprintf(output_data, "    \"percent-in-kernels\"     : %6.2f,\n",
            percentKokkos);
    fprintf(output_data, "    \"unique-kernel-calls\"    : %22llu,\n",
            (unsigned long long)count_map.size());
    fprintf(output_data, "\n");

    fprintf(output_data, "    \"region-perf-info\"       : [\n");

#define KERNEL_INFO_INDENT "       "

    bool print_comma = false;
    for (auto const& kernel : count_map) {
      if (!is_region(*std::get<1>(kernel))) continue;
      if (print_comma) fprintf(output_data, ",\n");
      kernel.second->writeToJSONFile(output_data, KERNEL_INFO_INDENT);
      print_comma = true;
    }

    fprintf(output_data, "\n");
    fprintf(output_data, "    ],\n");

    fprintf(output_data, "    \"kernel-perf-info\"       : [\n");

    print_comma = false;
    for (auto const& kernel : count_map) {
      if (is_region(*std::get<1>(kernel))) continue;
      if (print_comma) fprintf(output_data, ",\n");
      kernel.second->writeToJSONFile(output_data, KERNEL_INFO_INDENT);
      print_comma = true;
    }

    fprintf(output_data, "\n");
    fprintf(output_data, "    ]\n");

    fprintf(output_data, "}\n}");
  }

  fclose(output_data);

  char currentwd[256];
  getcwd(currentwd, 256);
  printf("KokkosP: Kernel timing written to %s/%s \n", currentwd, fileOutput);

  /*printf("\n");
  printf("======================================================================\n");
  printf("KokkosP: Finalization of Profiling Library\n");
  printf("KokkosP: Executed a total of %llu kernels\n", uniqID);

  std::vector<KernelPerformanceInfo*> kernelList;

  for(auto kernel_itr = count_map.begin(); kernel_itr != count_map.end();
  kernel_itr++) { kernelList.push_back(kernel_itr->second); kernelTimes +=
  kernel_itr->second->getTime();
  }

  std::sort(kernelList.begin(), kernelList.end(), compareKernelPerformanceInfo);
  const double totalExecuteTime = (finishTime - initTime);

  if(0 == strcmp(outputDelimiter, " ")) {
          printf("KokkosP: %100s %14s %14s %6s %6s %14s %4s\n", "Kernel",
  "Calls", "s/Total", "\%/Ko", "\%/Tot", "s/Call", "Type"); } else {
          printf("KokkosP: %s%s%s%s%s%s%s%s%s%s%s%s%s\n",
                  "Kernel",
                  outputDelimiter,
                  "Calls",
                  outputDelimiter,
                  "s/Total",
                  outputDelimiter,
                  "\%/Ko",
                  outputDelimiter,
                  "\%/Tot",
                  outputDelimiter,
                  "s/Call",
                  outputDelimiter,
                  "Type");
  }

  for(auto kernel_itr = kernelList.begin(); kernel_itr != kernelList.end();
  kernel_itr++) { KernelPerformanceInfo* kernelInfo = *kernel_itr;

          const uint64_t kCallCount = kernelInfo->getCallCount();
          const double   kTime      = kernelInfo->getTime();
          const double   kTimeMean  = kTime / (double) kCallCount;

          const std::string& kName   = kernelInfo->getName();
          char* kType = const_cast<char*>("");

          switch(kernelInfo->getKernelType()) {
          case PARALLEL_FOR:
                  kType = const_cast<char*>("PFOR"); break;
          case PARALLEL_SCAN:
                  kType = const_cast<char*>("SCAN"); break;
          case PARALLEL_REDUCE:
                  kType = const_cast<char*>("RDCE"); break;
          case REGION
                  kType = const_cast<char*>("REGI"); break;
          }

          int demangleStatus;
          char* finalDemangle = abi::__cxa_demangle(kName.c_str(), 0, 0,
  &demangleStatus);

          if(0 == strcmp(outputDelimiter, " ")) {
                  printf("KokkosP:
  %s%s%14llu%s%14.5f%s%6.2f%s%6.2f%s%14.5f%s%4s\n", (0 == demangleStatus) ?
  finalDemangle : kName.c_str(), outputDelimiter, kCallCount, outputDelimiter,
                          kTime,
                          outputDelimiter,
                          (kTime / kernelTimes) * 100.0,
                          outputDelimiter,
                          (kTime / totalExecuteTime) * 100.0,
                          outputDelimiter,
                          kTimeMean,
                          outputDelimiter,
                          kType
                          );
          } else {
                  printf("KokkosP: %s%s%llu%s%f%s%f%s%f%s%f%s%s\n",
                          (0 == demangleStatus) ? finalDemangle : kName.c_str(),
                          outputDelimiter,
                          kCallCount,
                          outputDelimiter,
                          kTime,
                          outputDelimiter,
                          (kTime / kernelTimes) * 100.0,
                          outputDelimiter,
                          (kTime / totalExecuteTime) * 100.0,
                          outputDelimiter,
                          kTimeMean,
                          outputDelimiter,
                          kType
                          );
          }
  }

  printf("\n");
  printf("KokkosP: Total Execution Time:        %15.6f seconds.\n",
  totalExecuteTime); printf("KokkosP: Time in Kokkos Kernels:      %15.6f
  seconds.\n", kernelTimes); printf("KokkosP: Time spent outside Kokkos: %15.6f
  seconds.\n", (totalExecuteTime - kernelTimes));

  const double percentKokkos = (kernelTimes / totalExecuteTime) * 100.0;
  printf("KokkosP: Runtime in Kokkos Kernels:   %15.6f \%\n", percentKokkos);
  printf("KokkosP: Unique kernels:              %22llu \n", (uint64_t)
  count_map.size()); printf("KokkosP: Parallel For Calls:          %22llu \n",
  uniqID);

  printf("\n");
  printf("======================================================================\n");
  printf("\n");

  if(NULL != outputDelimiter) {
          free(outputDelimiter);
  }*/
}